

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase436::run(TestCase436 *this)

{
  SourceLocation location;
  bool bVar1;
  int local_1a0;
  bool local_199;
  int local_198;
  DebugExpression<int> DStack_194;
  bool _kj_shouldLog;
  undefined1 local_190 [8];
  DebugComparison<int,_int_&> _kjCondition;
  SourceLocation local_160;
  undefined1 local_148 [24];
  Type local_130;
  undefined1 local_120 [24];
  PromiseArena *pPStack_108;
  _func_int **local_100;
  undefined1 local_f8 [8];
  TaskSet tasks;
  ErrorHandlerImpl errorHandler;
  int counter;
  undefined1 local_a8 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase436 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)local_a8,(EventLoop *)&waitScope.runningStacksPool);
  errorHandler.super_ErrorHandler._vptr_ErrorHandler._0_4_ = 0;
  run::ErrorHandlerImpl::ErrorHandlerImpl((ErrorHandlerImpl *)&tasks.location.lineNumber);
  SourceLocation::SourceLocation
            ((SourceLocation *)(local_120 + 0x10),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x1c1,0xf);
  location.function = (char *)pPStack_108;
  location.fileName = (char *)local_120._16_8_;
  location._16_8_ = local_100;
  TaskSet::TaskSet((TaskSet *)local_f8,(ErrorHandler *)&tasks.location.lineNumber,location);
  local_130.counter = (int *)&errorHandler;
  local_130.tasks = (TaskSet *)local_f8;
  evalLater<kj::(anonymous_namespace)::TestCase436::run()::__0>((kj *)local_120,&local_130);
  TaskSet::add((TaskSet *)local_f8,(Promise<void> *)local_120);
  Promise<void>::~Promise((Promise<void> *)local_120);
  local_148._8_8_ = &errorHandler;
  evalLater<kj::(anonymous_namespace)::TestCase436::run()::__1>
            ((kj *)(local_148 + 0x10),(Type *)(local_148 + 8));
  TaskSet::add((TaskSet *)local_f8,(Promise<void> *)(local_148 + 0x10));
  Promise<void>::~Promise((Promise<void> *)(local_148 + 0x10));
  TaskSet::onEmpty((TaskSet *)local_148);
  SourceLocation::SourceLocation
            (&local_160,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x1fa,3);
  Promise<void>::wait((Promise<void> *)local_148,local_a8);
  Promise<void>::~Promise((Promise<void> *)local_148);
  local_198 = 0xb;
  DStack_194 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_198);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_190,&stack0xfffffffffffffe6c,(int *)&errorHandler)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_190);
  if (!bVar1) {
    local_199 = kj::_::Debug::shouldLog(ERROR);
    while (local_199 != false) {
      local_1a0 = 0xb;
      kj::_::Debug::log<char_const(&)[35],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x1fc,ERROR,
                 "\"failed: expected \" \"(11) == (counter)\", _kjCondition, 11, counter",
                 (char (*) [35])"failed: expected (11) == (counter)",
                 (DebugComparison<int,_int_&> *)local_190,&local_1a0,(int *)&errorHandler);
      local_199 = false;
    }
  }
  TaskSet::~TaskSet((TaskSet *)local_f8);
  WaitScope::~WaitScope((WaitScope *)local_a8);
  EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Async, Ordering) {
  EventLoop loop;
  WaitScope waitScope(loop);

  class ErrorHandlerImpl: public TaskSet::ErrorHandler {
  public:
    void taskFailed(kj::Exception&& exception) override {
      KJ_FAIL_EXPECT(exception);
    }
  };

  int counter = 0;
  ErrorHandlerImpl errorHandler;
  kj::TaskSet tasks(errorHandler);

  tasks.add(evalLater([&]() {
    EXPECT_EQ(0, counter++);

    {
      // Use a promise and fulfiller so that we can fulfill the promise after waiting on it in
      // order to induce depth-first scheduling.
      auto paf = kj::newPromiseAndFulfiller<void>();
      tasks.add(paf.promise.then([&]() {
        EXPECT_EQ(1, counter++);
      }));
      paf.fulfiller->fulfill();
    }

    // .then() is scheduled breadth-first if the promise has already resolved, but depth-first
    // if the promise resolves later.
    tasks.add(Promise<void>(READY_NOW).then([&]() {
      EXPECT_EQ(4, counter++);
    }).then([&]() {
      EXPECT_EQ(5, counter++);
      tasks.add(kj::evalLast([&]() {
        EXPECT_EQ(7, counter++);
        tasks.add(kj::evalLater([&]() {
          EXPECT_EQ(8, counter++);
        }));
      }));
    }));

    {
      auto paf = kj::newPromiseAndFulfiller<void>();
      tasks.add(paf.promise.then([&]() {
        EXPECT_EQ(2, counter++);
        tasks.add(kj::evalLast([&]() {
          EXPECT_EQ(9, counter++);
          tasks.add(kj::evalLater([&]() {
            EXPECT_EQ(10, counter++);
          }));
        }));
      }));
      paf.fulfiller->fulfill();
    }

    // evalLater() is like READY_NOW.then().
    tasks.add(evalLater([&]() {
      EXPECT_EQ(6, counter++);
    }));
  }));

  tasks.add(evalLater([&]() {
    EXPECT_EQ(3, counter++);

    // Making this a chain should NOT cause it to preempt the first promise.  (This was a problem
    // at one point.)
    return Promise<void>(READY_NOW);
  }));

  tasks.onEmpty().wait(waitScope);

  EXPECT_EQ(11, counter);
}